

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModule.h
# Opt level: O3

void __thiscall
TObjectConstructorConcrete<TActual<TestSharedPtrObj>_>::DeRegister
          (TObjectConstructorConcrete<TActual<TestSharedPtrObj>_> *this,PerTypeObjectId id)

{
  pointer ppIVar1;
  iterator __position;
  pointer ppIVar2;
  PerTypeObjectId local_18;
  
  ppIVar2 = (this->m_ConstructedObjects).
            super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_ConstructedObjects).
            super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((long)ppIVar1 - (long)ppIVar2 >> 3) - 1U == id) {
    (this->m_ConstructedObjects).
    super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar1 + -1;
  }
  else {
    __position._M_current =
         (this->m_FreeIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_FreeIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_18 = id;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_FreeIds,__position,
                 &local_18);
      ppIVar2 = (this->m_ConstructedObjects).
                super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      id = local_18;
    }
    else {
      *__position._M_current = id;
      (this->m_FreeIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    ppIVar2[id] = (IObjectSharedState *)0x0;
  }
  return;
}

Assistant:

void DeRegister( PerTypeObjectId id )
    {
        //remove from constructed objects.
        //use swap with last one
        if( m_ConstructedObjects.size() - 1 == id )
        {
            //it's the last one, just remove it.
            m_ConstructedObjects.pop_back();
        }
        else
        {
            m_FreeIds.push_back( id );
            m_ConstructedObjects[ id ] = 0;
        }
    }